

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApprovalTestNamer.cpp
# Opt level: O1

string * ApprovalTests::TestName::getRootDirectory_abi_cxx11_(void)

{
  runtime_error *this;
  string *in_RDI;
  string asStack_38 [32];
  
  rootDirectoryStorage_abi_cxx11_();
  if (rootDirectoryStorage[abi:cxx11]()::rootDirectory_abi_cxx11_._M_string_length != 0) {
    rootDirectoryStorage_abi_cxx11_();
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    ::std::__cxx11::string::_M_construct<char*>();
    return in_RDI;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  HelpMessages::getUnconfiguredRootDirectory_abi_cxx11_();
  ::std::runtime_error::runtime_error(this,asStack_38);
  __cxa_throw(this,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

std::string TestName::getRootDirectory()
    {
        if (!rootDirectoryStorage().empty())
        {
            return rootDirectoryStorage();
        }
        else
        {
            throw std::runtime_error(HelpMessages::getUnconfiguredRootDirectory());
        }
    }